

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomFragmentOpTests.cpp
# Opt level: O3

UVec4 __thiscall
deqp::gles2::Functional::RandomFragmentOpCase::getCompareThreshold(RandomFragmentOpCase *this)

{
  RenderTarget *pRVar1;
  undefined8 uVar2;
  Vector<unsigned_int,_4> *res;
  long in_RSI;
  IVec4 IVar3;
  UVec4 UVar4;
  RGBA local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  
  pRVar1 = Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
  if (((pRVar1->m_pixelFormat).blueBits == 8 &&
       ((pRVar1->m_pixelFormat).greenBits == 8 && (pRVar1->m_pixelFormat).redBits == 8)) &&
     (((pRVar1->m_pixelFormat).alphaBits & 0xfffffff7U) == 0)) {
    IVar3 = tcu::RGBA::toIVec(&local_28);
    uVar2 = IVar3.m_data._8_8_;
    *(deUint32 *)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         local_28.m_value + 6;
    *(int *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4) =
         iStack_24 + 6;
    *(int *)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = iStack_20 + 6;
    *(int *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx + 4) =
         iStack_1c + 6;
  }
  else {
    IVar3 = tcu::RGBA::toIVec(&local_28);
    uVar2 = IVar3.m_data._8_8_;
    *(deUint32 *)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         local_28.m_value * 5 + 2;
    *(int *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4) =
         iStack_24 * 5 + 2;
    *(int *)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = iStack_20 * 5 + 2;
    *(int *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx + 4) =
         iStack_1c * 5 + 2;
  }
  UVar4.m_data[2] = (int)uVar2;
  UVar4.m_data[3] = (int)((ulong)uVar2 >> 0x20);
  UVar4.m_data._0_8_ = this;
  return (UVec4)UVar4.m_data;
}

Assistant:

tcu::UVec4 RandomFragmentOpCase::getCompareThreshold (void) const
{
	tcu::PixelFormat format = m_context.getRenderTarget().getPixelFormat();

	if (format == tcu::PixelFormat(8, 8, 8, 8) || format == tcu::PixelFormat(8, 8, 8, 0))
		return format.getColorThreshold().toIVec().asUint() + tcu::UVec4(6); // Default threshold.
	else
		return format.getColorThreshold().toIVec().asUint()
			   * tcu::UVec4(5) + tcu::UVec4(2); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; especially multiple blendings bring extra inaccuracy.
}